

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O0

unique_ptr<duckdb::ColumnWriterPageState,_std::default_delete<duckdb::ColumnWriterPageState>,_true>
__thiscall
duckdb::StandardColumnWriter<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetBlobOperator>::
InitializePageState(StandardColumnWriter<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetBlobOperator>
                    *this,PrimitiveColumnWriterState *state_p,idx_t page_idx)

{
  StandardColumnWriterState<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetBlobOperator> *args_2
  ;
  PrimitiveDictionary<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetBlobOperator> *args_3;
  unsigned_long *in_RCX;
  unsigned_long *in_RDX;
  unique_ptr<duckdb::ColumnWriterPageState,_std::default_delete<duckdb::ColumnWriterPageState>_>
  in_RDI;
  templated_unique_single_t result;
  value_type *page_info;
  StandardColumnWriterState<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetBlobOperator> *state;
  unique_ptr<duckdb::StandardWriterPageState<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetBlobOperator>,_std::default_delete<duckdb::StandardWriterPageState<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetBlobOperator>_>_>
  *in_stack_ffffffffffffffa8;
  __uniq_ptr_impl<duckdb::ColumnWriterPageState,_std::default_delete<duckdb::ColumnWriterPageState>_>
  this_00;
  
  this_00._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnWriterPageState_*,_std::default_delete<duckdb::ColumnWriterPageState>_>
  .super__Head_base<0UL,_duckdb::ColumnWriterPageState_*,_false>._M_head_impl =
       (tuple<duckdb::ColumnWriterPageState_*,_std::default_delete<duckdb::ColumnWriterPageState>_>)
       (tuple<duckdb::ColumnWriterPageState_*,_std::default_delete<duckdb::ColumnWriterPageState>_>)
       in_RDI._M_t.
       super___uniq_ptr_impl<duckdb::ColumnWriterPageState,_std::default_delete<duckdb::ColumnWriterPageState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ColumnWriterPageState_*,_std::default_delete<duckdb::ColumnWriterPageState>_>
       .super__Head_base<0UL,_duckdb::ColumnWriterPageState_*,_false>._M_head_impl;
  args_2 = ColumnWriterState::
           Cast<duckdb::StandardColumnWriterState<duckdb::string_t,duckdb::string_t,duckdb::ParquetBlobOperator>>
                     ((ColumnWriterState *)
                      in_RDI._M_t.
                      super___uniq_ptr_impl<duckdb::ColumnWriterPageState,_std::default_delete<duckdb::ColumnWriterPageState>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_duckdb::ColumnWriterPageState_*,_std::default_delete<duckdb::ColumnWriterPageState>_>
                      .super__Head_base<0UL,_duckdb::ColumnWriterPageState_*,_false>._M_head_impl);
  args_3 = (PrimitiveDictionary<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetBlobOperator> *)
           vector<duckdb::PageInformation,_true>::operator[]
                     ((vector<duckdb::PageInformation,_true> *)
                      this_00._M_t.
                      super__Tuple_impl<0UL,_duckdb::ColumnWriterPageState_*,_std::default_delete<duckdb::ColumnWriterPageState>_>
                      .super__Head_base<0UL,_duckdb::ColumnWriterPageState_*,_false>._M_head_impl,
                      (size_type)in_stack_ffffffffffffffa8);
  make_uniq<duckdb::StandardWriterPageState<duckdb::string_t,duckdb::string_t,duckdb::ParquetBlobOperator>,unsigned_long,unsigned_long&,duckdb_parquet::Encoding::type&,duckdb::PrimitiveDictionary<duckdb::string_t,duckdb::string_t,duckdb::ParquetBlobOperator>&>
            (in_RDX,in_RCX,(type *)args_2,args_3);
  unique_ptr<duckdb::ColumnWriterPageState,std::default_delete<duckdb::ColumnWriterPageState>,true>
  ::
  unique_ptr<duckdb::StandardWriterPageState<duckdb::string_t,duckdb::unique_ptr<duckdb::ColumnWriterPageState,std::default_delete<duckdb::ColumnWriterPageState>,true>::unique_ptr,duckdb::ParquetBlobOperator>,std::default_delete<duckdb::string_t>,void>
            ((unique_ptr<duckdb::ColumnWriterPageState,_std::default_delete<duckdb::ColumnWriterPageState>,_true>
              *)this_00._M_t.
                super__Tuple_impl<0UL,_duckdb::ColumnWriterPageState_*,_std::default_delete<duckdb::ColumnWriterPageState>_>
                .super__Head_base<0UL,_duckdb::ColumnWriterPageState_*,_false>._M_head_impl,
             in_stack_ffffffffffffffa8);
  unique_ptr<duckdb::StandardWriterPageState<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetBlobOperator>,_std::default_delete<duckdb::StandardWriterPageState<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetBlobOperator>_>,_true>
  ::~unique_ptr((unique_ptr<duckdb::StandardWriterPageState<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetBlobOperator>,_std::default_delete<duckdb::StandardWriterPageState<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetBlobOperator>_>,_true>
                 *)0x601c8e);
  return (unique_ptr<duckdb::ColumnWriterPageState,_std::default_delete<duckdb::ColumnWriterPageState>_>
          )(__uniq_ptr_impl<duckdb::ColumnWriterPageState,_std::default_delete<duckdb::ColumnWriterPageState>_>
            )in_RDI._M_t.
             super___uniq_ptr_impl<duckdb::ColumnWriterPageState,_std::default_delete<duckdb::ColumnWriterPageState>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::ColumnWriterPageState_*,_std::default_delete<duckdb::ColumnWriterPageState>_>
             .super__Head_base<0UL,_duckdb::ColumnWriterPageState_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<ColumnWriterPageState> InitializePageState(PrimitiveColumnWriterState &state_p,
	                                                      idx_t page_idx) override {
		auto &state = state_p.Cast<StandardColumnWriterState<SRC, TGT, OP>>();
		const auto &page_info = state_p.page_info[page_idx];
		auto result = make_uniq<StandardWriterPageState<SRC, TGT, OP>>(
		    page_info.row_count - (page_info.empty_count + page_info.null_count), state.total_string_size,
		    state.encoding, state.dictionary);
		return std::move(result);
	}